

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall Fossilize::StreamArchive::prepare(StreamArchive *this)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  size_type sVar4;
  char *pcVar5;
  FILE *pFVar6;
  reference ppEVar7;
  PayloadHeaderRaw *pPVar8;
  size_t sVar9;
  ulong uVar10;
  undefined1 local_110 [8];
  Entry entry;
  uint64_t value;
  char acStack_e8 [4];
  uint tag;
  char value_str [17];
  char local_c8 [8];
  char tag_str [17];
  undefined1 local_a8 [8];
  PayloadHeader header;
  char bytes_to_read [56];
  PayloadHeaderRaw *header_raw;
  size_t begin_append_offset;
  size_t offset;
  undefined1 local_38 [4];
  int version;
  uint8_t magic [16];
  size_t len;
  StreamArchive *this_local;
  
  bVar1 = std::
          vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
          ::empty(&((this->super_DatabaseInterface).impl)->imported_metadata);
  if ((bVar1) || (this->mode == ReadOnly)) {
    sVar4 = std::
            vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ::size(&((this->super_DatabaseInterface).impl)->imported_metadata);
    if (sVar4 < 2) {
      switch(this->mode) {
      case Append:
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pFVar6 = fopen(pcVar5,"r+b");
        this->file = (FILE *)pFVar6;
        if (this->file == (FILE *)0x0) {
          pcVar5 = (char *)std::__cxx11::string::c_str();
          pFVar6 = fopen(pcVar5,"wb");
          this->file = (FILE *)pFVar6;
        }
        break;
      case ReadOnly:
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pFVar6 = fopen(pcVar5,"rb");
        this->file = (FILE *)pFVar6;
        break;
      case AppendWithReadOnlyAccess:
        return false;
      case OverWrite:
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pFVar6 = fopen(pcVar5,"wb");
        this->file = (FILE *)pFVar6;
        break;
      case ExclusiveOverWrite:
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pFVar6 = fopen(pcVar5,"wbx");
        this->file = (FILE *)pFVar6;
      }
      if (this->file == (FILE *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = std::
                vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                ::empty(&((this->super_DatabaseInterface).impl)->imported_metadata);
        if (bVar1) {
          if ((this->mode == OverWrite) || (this->mode == ExclusiveOverWrite)) {
            sVar9 = fwrite(&stream_reference_magic_and_version,1,0x10,(FILE *)this->file);
            if (sVar9 != 0x10) {
              return false;
            }
          }
          else {
            iVar2 = fileno((FILE *)this->file);
            iVar2 = posix_fadvise(iVar2,0,0,2);
            if (((iVar2 != 0) && (LVar3 = get_thread_log_level(), (int)LVar3 < 2)) &&
               (bVar1 = Internal::log_thread_callback
                                  (LOG_DEFAULT,
                                   "Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
                                  ), !bVar1)) {
              fprintf(_stderr,
                      "Fossilize WARN: Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
                     );
            }
            fseek((FILE *)this->file,0,2);
            pPVar8 = (PayloadHeaderRaw *)ftell((FILE *)this->file);
            rewind((FILE *)this->file);
            if ((pPVar8 == (PayloadHeaderRaw *)0x0) ||
               (bVar1 = std::atomic<bool>::load
                                  ((atomic<bool> *)&shutdown_requested,memory_order_relaxed), bVar1)
               ) {
              sVar9 = fwrite(&stream_reference_magic_and_version,1,0x10,(FILE *)this->file);
              if (sVar9 != 0x10) {
                return false;
              }
            }
            else {
              sVar9 = fread(local_38,1,0x10,(FILE *)this->file);
              if (sVar9 != 0x10) {
                return false;
              }
              iVar2 = memcmp(local_38,&stream_reference_magic_and_version,0xf);
              if (iVar2 != 0) {
                return false;
              }
              if ((6 < magic[7]) || (magic[7] < 5)) {
                return false;
              }
              header_raw = pPVar8;
              for (begin_append_offset = 0x10; begin_append_offset < pPVar8;
                  begin_append_offset = (uint)local_a8._0_4_ + begin_append_offset) {
                bVar1 = std::atomic<bool>::load
                                  ((atomic<bool> *)&shutdown_requested,memory_order_relaxed);
                if (bVar1) {
                  return false;
                }
                header_raw = (PayloadHeaderRaw *)begin_append_offset;
                memset(local_a8,0,0x10);
                if (pPVar8 < (PayloadHeaderRaw *)(begin_append_offset + 0x38)) {
                  LVar3 = get_thread_log_level();
                  if (((int)LVar3 < 2) &&
                     (bVar1 = Internal::log_thread_callback
                                        (LOG_DEFAULT,
                                         "Detected sliced file. Dropping entries from here.\n"),
                     !bVar1)) {
                    fprintf(_stderr,
                            "Fossilize WARN: Detected sliced file. Dropping entries from here.\n");
                  }
                  break;
                }
                sVar9 = fread(&header.crc,1,0x38,(FILE *)this->file);
                if (sVar9 != 0x38) {
                  return false;
                }
                begin_append_offset = begin_append_offset + 0x38;
                convert_from_le((PayloadHeader *)local_a8,(PayloadHeaderRaw *)(bytes_to_read + 0x20)
                               );
                if (pPVar8 < (PayloadHeaderRaw *)(begin_append_offset + (uint)local_a8._0_4_)) {
                  LVar3 = get_thread_log_level();
                  if (((int)LVar3 < 2) &&
                     (bVar1 = Internal::log_thread_callback
                                        (LOG_DEFAULT,
                                         "Detected sliced file. Dropping entries from here.\n"),
                     !bVar1)) {
                    fprintf(_stderr,
                            "Fossilize WARN: Detected sliced file. Dropping entries from here.\n");
                  }
                  break;
                }
                memset(local_c8,0,0x11);
                memset(acStack_e8,0,0x11);
                local_c8[0] = bytes_to_read[0];
                local_c8[1] = bytes_to_read[1];
                local_c8[2] = bytes_to_read[2];
                local_c8[3] = bytes_to_read[3];
                local_c8[4] = bytes_to_read[4];
                local_c8[5] = bytes_to_read[5];
                local_c8[6] = bytes_to_read[6];
                local_c8[7] = bytes_to_read[7];
                tag_str[0] = bytes_to_read[8];
                tag_str[1] = bytes_to_read[9];
                tag_str[2] = bytes_to_read[10];
                tag_str[3] = bytes_to_read[0xb];
                tag_str[4] = bytes_to_read[0xc];
                tag_str[5] = bytes_to_read[0xd];
                tag_str[6] = bytes_to_read[0xe];
                tag_str[7] = bytes_to_read[0xf];
                acStack_e8[0] = bytes_to_read[0x10];
                acStack_e8[1] = bytes_to_read[0x11];
                acStack_e8[2] = bytes_to_read[0x12];
                acStack_e8[3] = bytes_to_read[0x13];
                tag._0_1_ = bytes_to_read[0x14];
                tag._1_1_ = bytes_to_read[0x15];
                tag._2_1_ = bytes_to_read[0x16];
                tag._3_1_ = bytes_to_read[0x17];
                value_str[0] = bytes_to_read[0x18];
                value_str[1] = bytes_to_read[0x19];
                value_str[2] = bytes_to_read[0x1a];
                value_str[3] = bytes_to_read[0x1b];
                value_str[4] = bytes_to_read[0x1c];
                value_str[5] = bytes_to_read[0x1d];
                value_str[6] = bytes_to_read[0x1e];
                value_str[7] = bytes_to_read[0x1f];
                uVar10 = strtoul(local_c8,(char **)0x0,0x10);
                if ((ResourceTag)uVar10 < RESOURCE_COUNT) {
                  entry.header._8_8_ = strtoull(acStack_e8,(char **)0x0,0x10);
                  memset(local_110,0,0x18);
                  entry.header.payload_size = header.payload_size;
                  entry.header.format = header.format;
                  local_110 = (undefined1  [8])begin_append_offset;
                  bVar1 = DatabaseInterface::test_resource_filter
                                    (&this->super_DatabaseInterface,(ResourceTag)uVar10,
                                     entry.header._8_8_);
                  if (bVar1) {
                    std::
                    unordered_map<unsigned_long,Fossilize::StreamArchive::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>>
                    ::emplace<unsigned_long&,Fossilize::StreamArchive::Entry&>
                              ((unordered_map<unsigned_long,Fossilize::StreamArchive::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>>
                                *)(this->seen_blobs + (uVar10 & 0xffffffff)),
                               (unsigned_long *)&entry.header.crc,(Entry *)local_110);
                  }
                }
                iVar2 = fseek((FILE *)this->file,(ulong)(uint)local_a8._0_4_,1);
                if (iVar2 < 0) {
                  return false;
                }
              }
              if (((this->mode == Append) && ((PayloadHeaderRaw *)begin_append_offset != pPVar8)) &&
                 (iVar2 = fseek((FILE *)this->file,(long)header_raw,0), iVar2 < 0)) {
                return false;
              }
            }
          }
        }
        else {
          ppEVar7 = std::
                    vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                    ::operator[](&((this->super_DatabaseInterface).impl)->imported_metadata,0);
          this->imported_metadata = *ppEVar7;
          iVar2 = fileno((FILE *)this->file);
          iVar2 = posix_fadvise(iVar2,0,0,1);
          if (((iVar2 != 0) && (LVar3 = get_thread_log_level(), (int)LVar3 < 2)) &&
             (bVar1 = Internal::log_thread_callback
                                (LOG_DEFAULT,
                                 "Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
                                ), !bVar1)) {
            fprintf(_stderr,
                    "Fossilize WARN: Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
                   );
          }
        }
        this->alive = true;
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool prepare() override
	{
		if (!impl->imported_metadata.empty() && mode != DatabaseMode::ReadOnly)
			return false;
		if (impl->imported_metadata.size() > 1)
			return false;

		switch (mode)
		{
		case DatabaseMode::ReadOnly:
#if _WIN32
			{
				file = nullptr;
				int fd = _open(path.c_str(), _O_BINARY | _O_RDONLY |
				               (impl->imported_metadata.empty() ? _O_SEQUENTIAL : _O_RANDOM),
				               _S_IREAD);
				if (fd >= 0)
					file = _fdopen(fd, "rb");
			}
#else
			file = fopen(path.c_str(), "rb");
#endif
			break;

		case DatabaseMode::Append:
			file = fopen(path.c_str(), "r+b");
			// r+b on empty file does not seem to work on Windows, so just fall back to wb.
			if (!file)
				file = fopen(path.c_str(), "wb");
			break;

		case DatabaseMode::AppendWithReadOnlyAccess:
			return false;

		case DatabaseMode::OverWrite:
			file = fopen(path.c_str(), "wb");
			break;

		case DatabaseMode::ExclusiveOverWrite:
		{
#ifdef _WIN32
			file = nullptr;
			int fd = _open(path.c_str(), _O_BINARY | _O_WRONLY | _O_CREAT | _O_EXCL | _O_TRUNC | _O_SEQUENTIAL, _S_IWRITE | _S_IREAD);
			if (fd >= 0)
				file = _fdopen(fd, "wb");
#else
			file = fopen(path.c_str(), "wbx");
#endif
			break;
		}
		}

		if (!file)
			return false;

		if (!impl->imported_metadata.empty())
		{
			// Do nothing here. TODO: Set fadvise to RANDOM here.
			imported_metadata = impl->imported_metadata[0];
#ifdef __linux__
			// We're going to be doing scattered reads, which hopefully have been cached earlier.
			// However, if the archive has been paged out, RANDOM is the correct approach,
			// since prefetching data is only detrimental.
			if (posix_fadvise(fileno(file), 0, 0, POSIX_FADV_RANDOM) != 0)
				LOGW_LEVEL("Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n");
#endif
		}
		else if (mode != DatabaseMode::OverWrite && mode != DatabaseMode::ExclusiveOverWrite)
		{
#if _WIN32
			if (mode == DatabaseMode::ReadOnly)
			{
				// Set the buffer size to reduce I/O cost of sparse freads
				setvbuf(file, nullptr, _IOFBF, FOSSILIZE_BLOB_HASH_LENGTH + sizeof(PayloadHeaderRaw));
			}
#endif

#ifdef __linux__
			// We're going to scan through the archive sequentially to discover metadata, so some prefetching is welcome.
			if (posix_fadvise(fileno(file), 0, 0, POSIX_FADV_SEQUENTIAL) != 0)
				LOGW_LEVEL("Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n");
#endif

			// Scan through the archive and get the list of files.
			fseek(file, 0, SEEK_END);
			size_t len = ftell(file);
			rewind(file);

			if (len != 0 && !shutdown_requested.load(std::memory_order_relaxed))
			{
				uint8_t magic[MagicSize];
				if (fread(magic, 1, MagicSize, file) != MagicSize)
					return false;

				if (memcmp(magic, stream_reference_magic_and_version, MagicSize - 1))
					return false;
				int version = magic[MagicSize - 1];
				if (version > FOSSILIZE_FORMAT_VERSION || version < FOSSILIZE_FORMAT_MIN_COMPAT_VERSION)
					return false;

				size_t offset = MagicSize;
				size_t begin_append_offset = len;

				while (offset < len)
				{
					if (shutdown_requested.load(std::memory_order_relaxed))
						return false;

					begin_append_offset = offset;

					PayloadHeaderRaw *header_raw = nullptr;
					char bytes_to_read[FOSSILIZE_BLOB_HASH_LENGTH + sizeof(PayloadHeaderRaw)];
					PayloadHeader header = {};

					// Corrupt entry. Our process might have been killed before we could write all data.
					if (offset + sizeof(bytes_to_read) > len)
					{
						LOGW_LEVEL("Detected sliced file. Dropping entries from here.\n");
						break;
					}

					// NAME + HEADER in one read
					if (fread(bytes_to_read, 1, sizeof(bytes_to_read), file) != sizeof(bytes_to_read))
						return false;
					offset += sizeof(bytes_to_read);
					header_raw = (PayloadHeaderRaw*)&bytes_to_read[FOSSILIZE_BLOB_HASH_LENGTH];
					convert_from_le(header, *header_raw);

					// Corrupt entry. Our process might have been killed before we could write all data.
					if (offset + header.payload_size > len)
					{
						LOGW_LEVEL("Detected sliced file. Dropping entries from here.\n");
						break;
					}

					char tag_str[16 + 1] = {};
					char value_str[16 + 1] = {};
					memcpy(tag_str, bytes_to_read + FOSSILIZE_BLOB_HASH_LENGTH - 32, 16);
					memcpy(value_str, bytes_to_read + FOSSILIZE_BLOB_HASH_LENGTH - 16, 16);

					auto tag = unsigned(strtoul(tag_str, nullptr, 16));
					if (tag < RESOURCE_COUNT)
					{
						uint64_t value = strtoull(value_str, nullptr, 16);
						Entry entry = {};
						entry.header = header;
						entry.offset = offset;
						if (test_resource_filter(static_cast<ResourceTag>(tag), value))
							seen_blobs[tag].emplace(value, entry);
					}

					if (fseek(file, header.payload_size, SEEK_CUR) < 0)
						return false;

					offset += header.payload_size;
				}

				if (mode == DatabaseMode::Append && offset != len)
				{
					if (fseek(file, begin_append_offset, SEEK_SET) < 0)
						return false;
				}
			}
			else
			{
				// Appending to a fresh file. Make sure we have the magic.
				if (fwrite(stream_reference_magic_and_version, 1,
				           sizeof(stream_reference_magic_and_version), file) != sizeof(stream_reference_magic_and_version))
					return false;
			}
		}
		else
		{
			if (fwrite(stream_reference_magic_and_version, 1, sizeof(stream_reference_magic_and_version), file) !=
			    sizeof(stream_reference_magic_and_version))
			{
				return false;
			}
		}

		alive = true;
		return true;
	}